

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O0

void __thiscall ChatClient::connectionCreated(ChatClient *this,Stream *stream)

{
  ostream *poVar1;
  string local_38;
  Stream *local_18;
  Stream *stream_local;
  ChatClient *this_local;
  
  local_18 = stream;
  stream_local = (Stream *)this;
  poVar1 = std::operator<<((ostream *)&std::cout,"Incoming connection ");
  Dashel::Stream::getTargetName_abi_cxx11_(&local_38,local_18);
  poVar1 = std::operator<<(poVar1,(string *)&local_38);
  poVar1 = std::operator<<(poVar1," (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18);
  poVar1 = std::operator<<(poVar1,")");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void connectionCreated(Stream* stream)
	{
		cout << "Incoming connection " << stream->getTargetName() << " (" << stream << ")" << endl;
	}